

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_sections_25(void)

{
  run("dotted names that cannot be resolved should be considered falsey",
      "\"{{#a.b.c}}Here{{/a.b.c}}\" == \"\"","{\"a\": {}}",(char *)0x0,"\"\" == \"\"");
  return;
}

Assistant:

static void
test_sections_25(void)
{
    run(
        "dotted names that cannot be resolved should be considered falsey",
        "\"{{#a.b.c}}Here{{/a.b.c}}\" == \"\"",
        "{\"a\": {}}",
        NULL,
        "\"\" == \"\""
    );
}